

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v6::
         vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                   (range out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                   args,locale_ref loc)

{
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  format_args;
  basic_string_view<char> str;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_RDX;
  locale_ref in_RSI;
  char *in_RDI;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *in_R8;
  size_t in_R9;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  h;
  char *in_stack_ffffffffffffff18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
  in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff58;
  range in_stack_ffffffffffffff60;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
  local_88 [2];
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  *pfStack_18;
  buffer<char> *local_8;
  
  str.size_ = in_stack_ffffffffffffff58;
  str.data_ = in_RDI;
  format_args.field_1.args_ = in_stack_ffffffffffffff48.args_;
  format_args.types_ = (unsigned_long_long)in_RDX;
  pfStack_18 = in_RDX;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::format_handler(in_R8,in_stack_ffffffffffffff60,str,format_args,in_RSI);
  format_str_00.size_ = in_R9;
  format_str_00.data_ = in_stack_ffffffffffffff18;
  internal::
  parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>&>
            (format_str_00,pfStack_18);
  local_8 = (buffer<char> *)
            basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
            ::out(local_88);
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::~format_handler((format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                     *)0x1147c2);
  return (iterator)local_8;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}